

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool fisk_check(double param_1,double b,double c)

{
  double c_local;
  double b_local;
  double param_0_local;
  
  if (0.0 < b) {
    if (0.0 < c) {
      param_0_local._7_1_ = true;
    }
    else {
      std::operator<<((ostream *)&std::cerr," \n");
      std::operator<<((ostream *)&std::cerr,"FISK_CHECK - Warning!\n");
      std::operator<<((ostream *)&std::cerr,"  C <= 0.\n");
      param_0_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"FISK_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  B <= 0.\n");
    param_0_local._7_1_ = false;
  }
  return param_0_local._7_1_;
}

Assistant:

bool fisk_check ( double /*a*/, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    FISK_CHECK checks the parameters of the Fisk PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < B,
//    0.0 < C.
//
//    Output, bool FISK_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "FISK_CHECK - Warning!\n";
    cerr << "  B <= 0.\n";
    return false;
  }

  if ( c <= 0.0 )
  {
    cerr << " \n";
    cerr << "FISK_CHECK - Warning!\n";
    cerr << "  C <= 0.\n";
    return false;
  }

  return true;
}